

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

void BM_Comb_filter(State *state)

{
  bool bVar1;
  long lVar2;
  array<float,_128UL> output;
  array<float,_512UL> input;
  undefined1 auStack_a18 [512];
  undefined8 local_818 [256];
  
  lVar2 = 0;
  do {
    *(undefined8 *)((long)local_818 + lVar2 * 4) = 0x3f8000003f800000;
    *(undefined8 *)((long)local_818 + lVar2 * 4 + 8) = 0x3f8000003f800000;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x200);
  bVar1 = benchmark::State::KeepRunning(state);
  if (bVar1) {
    do {
      re::math::comb_filter<float,512l,128l>
                ((span<const_float,_512L>)local_818,(span<float,_128L>)auStack_a18);
      bVar1 = benchmark::State::KeepRunning(state);
    } while (bVar1);
  }
  return;
}

Assistant:

static void BM_Comb_filter(benchmark::State& state) {
    std::array<float, 512> input;
    std::array<float, 128> output;
    input.fill(1);
    while (state.KeepRunning()) {
        re::math::comb_filter(
            gsl::span<float const, 512>{input},
            gsl::span<float, 128>{output}
        );
    }
}